

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O2

void __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::FinalizeGCM
          (AESStateMBEDTLS *this,data_ptr_t tag,idx_t tag_len)

{
  int iVar1;
  InternalException *this_00;
  InvalidInputException *this_01;
  allocator local_49;
  string local_48;
  runtime_error local_28 [16];
  
  if (this->mode == DECRYPT) {
    iVar1 = mbedtls_cipher_check_tag
                      ((this->context).
                       super_unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                       ._M_t.
                       super___uniq_ptr_impl<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mbedtls_cipher_context_t_*,_std::default_delete<mbedtls_cipher_context_t>_>
                       .super__Head_base<0UL,_mbedtls_cipher_context_t_*,_false>._M_head_impl,tag,
                       tag_len);
    if (iVar1 != 0) {
      this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_48,
                 "Computed AES tag differs from read AES tag, are you using the right key?",
                 &local_49);
      duckdb::InvalidInputException::InvalidInputException(this_01,(string *)&local_48);
      __cxa_throw(this_01,&duckdb::InvalidInputException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
  }
  else {
    if (this->mode != ENCRYPT) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_48,"Unhandled encryption mode %d",&local_49);
      duckdb::InternalException::InternalException<int>(this_00,&local_48,this->mode);
      __cxa_throw(this_00,&duckdb::InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = mbedtls_cipher_write_tag
                      ((this->context).
                       super_unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                       ._M_t.
                       super___uniq_ptr_impl<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mbedtls_cipher_context_t_*,_std::default_delete<mbedtls_cipher_context_t>_>
                       .super__Head_base<0UL,_mbedtls_cipher_context_t_*,_false>._M_head_impl,tag,
                       tag_len);
    if (iVar1 != 0) {
      std::runtime_error::runtime_error(local_28,"Writing tag failed");
      std::runtime_error::~runtime_error(local_28);
    }
  }
  return;
}

Assistant:

void MbedTlsWrapper::AESStateMBEDTLS::FinalizeGCM(duckdb::data_ptr_t tag, duckdb::idx_t tag_len){

	switch (mode) {

	case ENCRYPT: {
		if (mbedtls_cipher_write_tag(context.get(), tag, tag_len) != 0) {
			runtime_error("Writing tag failed");
		}
		break;
	}

	case DECRYPT: {
		if (mbedtls_cipher_check_tag(context.get(), tag, tag_len) != 0) {
			throw duckdb::InvalidInputException(
			    "Computed AES tag differs from read AES tag, are you using the right key?");
		}
		break;
	}

	default:
		throw duckdb::InternalException("Unhandled encryption mode %d", static_cast<int>(mode));
	}
}